

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatWalk.cpp
# Opt level: O2

void __thiscall FatWalk::walk(FatWalk *this,int cluster)

{
  FatSystem *this_00;
  FatEntry root;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198 [32];
  FatEntry local_178;
  FatEntry local_c8;
  
  FatEntry::FatEntry(&local_178);
  this_00 = (this->super_FatModule).system;
  if (this_00->rootDirectory == (long)cluster) {
    FatSystem::rootEntry(&local_c8,this_00);
    FatEntry::operator=(&local_178,&local_c8);
    FatEntry::~FatEntry(&local_c8);
  }
  else {
    local_178.attributes = '\x10';
    local_178.cluster = cluster;
    std::__cxx11::string::assign((char *)&local_178.longName);
  }
  local_c8.shortName.field_2._8_8_ = &local_c8.shortName._M_string_length;
  local_c8.shortName._M_string_length._0_4_ = 0;
  local_c8.shortName.field_2._M_allocated_capacity = 0;
  local_c8.longName._M_string_length = 0;
  local_c8.longName._M_dataplus._M_p = (pointer)local_c8.shortName.field_2._8_8_;
  std::__cxx11::string::string<std::allocator<char>>(local_198,"/",&local_1b9);
  (*this->_vptr_FatWalk[1])(this,&local_178,&local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"/",&local_1b9);
  doWalk(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_c8,&local_178,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_c8);
  FatEntry::~FatEntry(&local_178);
  return;
}

Assistant:

void FatWalk::walk(int cluster)
{
    FatEntry root;

    if (cluster == system.rootDirectory) {
        root = system.rootEntry();
    } else {
        root.cluster = cluster;
        root.attributes = FAT_ATTRIBUTES_DIR;
        root.longName = "/";
    }
    set<int> visited;
    onEntry(root, root, "/");
    doWalk(visited, root, "/");
}